

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementBar::SetupInitial(ChElementBar *this,ChSystem *system)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_30);
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_48);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_30 - local_48;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (local_28 - local_40) * (local_28 - local_40);
  auVar1 = vfmadd231sd_fma(auVar2,auVar1,auVar1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_20 - local_38;
  auVar1 = vfmadd231sd_fma(auVar1,auVar3,auVar3);
  auVar1 = vsqrtsd_avx(auVar1,auVar1);
  this->length = auVar1._0_8_;
  this->mass = auVar1._0_8_ * this->area * this->density;
  return;
}

Assistant:

void ChElementBar::SetupInitial(ChSystem* system) {
    // Compute rest length, mass:
    this->length = (nodes[1]->GetX0() - nodes[0]->GetX0()).Length();
    this->mass = this->length * this->area * this->density;
}